

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svd22.c
# Opt level: O2

void svd_sym_singular_values(double A00,double A01,double A11,double *Lmin,double *Lmax)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  
  dVar1 = atan2(A01 - A01,A00 + A11);
  dVar2 = atan2(A01 + A01,A00 - A11);
  dVar8 = (dVar1 + dVar2) * 0.5;
  dVar3 = (dVar2 - dVar1) * 0.5;
  dVar2 = dVar8 - dVar3;
  dVar1 = cos(dVar2);
  dVar2 = sin(dVar2);
  dVar3 = dVar3 + dVar8;
  dVar8 = cos(dVar3);
  dVar3 = sin(dVar3);
  auVar4._8_8_ = A00 - A11;
  auVar4._0_8_ = A00 + A11;
  auVar5._8_4_ = SUB84(dVar8,0);
  auVar5._0_8_ = dVar1;
  auVar5._12_4_ = (int)((ulong)dVar8 >> 0x20);
  auVar5 = divpd(auVar4,auVar5);
  auVar6._8_8_ = A01 + A01;
  auVar6._0_8_ = A01 - A01;
  auVar7._8_8_ = dVar3;
  auVar7._0_8_ = dVar2;
  auVar7 = divpd(auVar6,auVar7);
  dVar2 = (double)(~-(ulong)(ABS(dVar2) < ABS(dVar1)) & auVar7._0_8_ |
                  auVar5._0_8_ & -(ulong)(ABS(dVar2) < ABS(dVar1)));
  dVar3 = (double)(~-(ulong)(ABS(dVar3) < ABS(dVar8)) & auVar7._8_8_ |
                  auVar5._8_8_ & -(ulong)(ABS(dVar3) < ABS(dVar8)));
  dVar1 = (dVar2 + dVar3) * 0.5;
  dVar3 = (dVar2 - dVar3) * 0.5;
  dVar2 = fmin(dVar1,dVar3);
  *Lmin = dVar2;
  dVar1 = fmax(dVar1,dVar3);
  *Lmax = dVar1;
  return;
}

Assistant:

void svd_sym_singular_values(double A00, double A01, double A11,
                             double *Lmin, double *Lmax)
{
    double A10 = A01;

    double B0 = A00 + A11;
    double B1 = A00 - A11;
    double B2 = A01 + A10;
    double B3 = A01 - A10;

    double PminusT = atan2(B3, B0);
    double PplusT = atan2(B2, B1);

    double P = (PminusT + PplusT) / 2;
    double T = (-PminusT + PplusT) / 2;

    // C0 = e+f. There are two ways to compute C0; we pick the one
    // that is better conditioned.
    double CPmT = cos(P-T), SPmT = sin(P-T);
    double C0 = 0;
    if (fabs(CPmT) > fabs(SPmT))
        C0 = B0 / CPmT;
    else
        C0 = B3 / SPmT;

    // C1 = e-f. There are two ways to compute C1; we pick the one
    // that is better conditioned.
    double CPpT = cos(P+T), SPpT = sin(P+T);
    double C1 = 0;
    if (fabs(CPpT) > fabs(SPpT))
        C1 = B1 / CPpT;
    else
        C1 = B2 / SPpT;

    // e and f are the singular values
    double e = (C0 + C1) / 2;
    double f = (C0 - C1) / 2;

    *Lmin = fmin(e, f);
    *Lmax = fmax(e, f);
}